

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnFixedString::ColumnFixedString(ColumnFixedString *this,size_t n)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  TypeRef *type;
  Column *in_stack_ffffffffffffffd0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffe8;
  
  type = (TypeRef *)&stack0xffffffffffffffe0;
  Type::CreateString((size_t)in_stack_ffffffffffffffe8._M_pi);
  Column::Column(in_stack_ffffffffffffffd0,type);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x2356c7);
  *in_RDI = &PTR__ColumnFixedString_002a0718;
  in_RDI[5] = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2356ec);
  return;
}

Assistant:

ColumnFixedString::ColumnFixedString(size_t n)
    : Column(Type::CreateString(n))
    , string_size_(n)
{
}